

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O1

void __thiscall
CMU462::PathTracer::raytrace_tile(PathTracer *this,int tile_x,int tile_y,int tile_w,int tile_h)

{
  int *piVar1;
  ulong uVar2;
  pointer pSVar3;
  ulong x0;
  long lVar4;
  ulong x1;
  ulong uVar5;
  ulong y0;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  Spectrum SVar10;
  Ray local_a0;
  
  uVar5 = (this->sampleBuffer).w;
  uVar2 = (this->sampleBuffer).h;
  x0 = (ulong)tile_x;
  x1 = (long)tile_w + x0;
  if (uVar5 < (long)tile_w + x0) {
    x1 = uVar5;
  }
  y0 = (ulong)tile_y;
  uVar5 = (long)tile_h + y0;
  if (uVar2 < (long)tile_h + y0) {
    uVar5 = uVar2;
  }
  uVar2 = this->imageTileSize;
  if (y0 < uVar5) {
    lVar8 = y0 * 0xc;
    uVar7 = y0;
    do {
      if (this->continueRaytracing != true) {
        return;
      }
      lVar6 = x1 - x0;
      lVar9 = x0 * 0xc + 8;
      if (x0 < x1) {
        do {
          Camera::generate_ray(&local_a0,this->camera,0.5,0.5);
          SVar10 = trace_ray(this,&local_a0);
          lVar4 = (this->sampleBuffer).w * lVar8;
          pSVar3 = (this->sampleBuffer).data.
                   super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(long *)((long)pSVar3 + lVar9 + -8 + lVar4) = SVar10._0_8_;
          *(float *)((long)&pSVar3->r + lVar9 + lVar4) = SVar10.b;
          lVar9 = lVar9 + 0xc;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0xc;
    } while (uVar7 != uVar5);
  }
  piVar1 = (this->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + x0 / uVar2 + (y0 / uVar2) * this->num_tiles_w;
  *piVar1 = *piVar1 + 1;
  HDRImageBuffer::toColor(&this->sampleBuffer,&this->frameBuffer,x0,y0,x1,uVar5);
  return;
}

Assistant:

void PathTracer::raytrace_tile(int tile_x, int tile_y,
      int tile_w, int tile_h) {

    size_t w = sampleBuffer.w;
    size_t h = sampleBuffer.h;

    size_t tile_start_x = tile_x;
    size_t tile_start_y = tile_y;

    size_t tile_end_x = std::min(tile_start_x + tile_w, w);
    size_t tile_end_y = std::min(tile_start_y + tile_h, h);

    size_t tile_idx_x = tile_x / imageTileSize;
    size_t tile_idx_y = tile_y / imageTileSize;
    size_t num_samples_tile = tile_samples[tile_idx_x + tile_idx_y * num_tiles_w];

    for (size_t y = tile_start_y; y < tile_end_y; y++) {
      if (!continueRaytracing) return;
      for (size_t x = tile_start_x; x < tile_end_x; x++) {
        Spectrum s = raytrace_pixel(x, y);
        sampleBuffer.update_pixel(s, x, y);
      }
    }

    tile_samples[tile_idx_x + tile_idx_y * num_tiles_w] += 1;
    sampleBuffer.toColor(frameBuffer, tile_start_x, tile_start_y, tile_end_x, tile_end_y);
  }